

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLStream.cpp
# Opt level: O0

void __thiscall
ODDLParser::IOStreamBase::IOStreamBase(IOStreamBase *this,StreamFormatterBase *formatter)

{
  StreamFormatterBase *this_00;
  StreamFormatterBase *formatter_local;
  IOStreamBase *this_local;
  
  this->_vptr_IOStreamBase = (_func_int **)&PTR__IOStreamBase_00ed8110;
  this->m_formatter = formatter;
  this->m_file = (FILE *)0x0;
  if (this->m_formatter == (StreamFormatterBase *)0x0) {
    this_00 = (StreamFormatterBase *)operator_new(8);
    StreamFormatterBase::StreamFormatterBase(this_00);
    this->m_formatter = this_00;
  }
  return;
}

Assistant:

IOStreamBase::IOStreamBase(StreamFormatterBase *formatter)
    : m_formatter(formatter)
    , m_file(ddl_nullptr) {
    if (ddl_nullptr == m_formatter) {
        m_formatter = new StreamFormatterBase;
    }
}